

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__init_zdefaults(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 0x90; local_c = local_c + 1) {
    stbi__zdefault_length[local_c] = '\b';
  }
  for (; local_c < 0x100; local_c = local_c + 1) {
    stbi__zdefault_length[local_c] = '\t';
  }
  for (; local_c < 0x118; local_c = local_c + 1) {
    stbi__zdefault_length[local_c] = '\a';
  }
  for (; local_c < 0x120; local_c = local_c + 1) {
    stbi__zdefault_length[local_c] = '\b';
  }
  for (local_c = 0; local_c < 0x20; local_c = local_c + 1) {
    stbi__zdefault_distance[local_c] = '\x05';
  }
  return;
}

Assistant:

static void stbi__init_zdefaults(void)
{
   int i;   // use <= to match clearly with spec
   for (i=0; i <= 143; ++i)     stbi__zdefault_length[i]   = 8;
   for (   ; i <= 255; ++i)     stbi__zdefault_length[i]   = 9;
   for (   ; i <= 279; ++i)     stbi__zdefault_length[i]   = 7;
   for (   ; i <= 287; ++i)     stbi__zdefault_length[i]   = 8;

   for (i=0; i <=  31; ++i)     stbi__zdefault_distance[i] = 5;
}